

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void sarimax_wrapper_predict
               (sarimax_wrapper_object obj,double *inp,double *xreg,int L,double *newxreg,
               double *xpred,double *amse)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int d;
  int N;
  int D;
  int iVar6;
  uint uVar7;
  sarimax_object psVar8;
  double *pdVar9;
  uint ip;
  int id;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  int iVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double *local_e0;
  
  psVar8 = obj->sarimax;
  uVar1 = psVar8->p;
  uVar2 = psVar8->P;
  uVar3 = psVar8->Q;
  iVar4 = psVar8->s;
  lVar19 = (long)iVar4;
  ip = iVar4 * uVar2 + uVar1;
  uVar5 = psVar8->q;
  uVar10 = uVar3 * iVar4 + uVar5 + 1;
  if ((int)uVar10 < (int)ip) {
    uVar10 = ip;
  }
  d = psVar8->d;
  N = psVar8->N;
  lVar11 = (long)N;
  D = psVar8->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar18 = iVar4 * D;
  C_00 = (double *)malloc((long)iVar18 * 8 + 8);
  id = d + iVar18;
  oup = (double *)malloc((long)id * 8 + 8);
  W = (double *)malloc(lVar11 * 8);
  resid = (double *)malloc(lVar11 * 8);
  iVar6 = obj->idrift;
  phi = (double *)malloc((long)(int)uVar10 << 3);
  theta = (double *)malloc((long)(int)uVar10 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  dVar20 = 0.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    dVar20 = psVar8->mean;
  }
  if (0 < d) {
    deld(d,C);
  }
  if (0 < D) {
    delds(D,iVar4,C_00);
  }
  conv(C,d + 1,C_00,iVar18 + 1,oup);
  if (0 < id) {
    uVar12 = 1;
    do {
      oup[uVar12] = -oup[uVar12];
      uVar12 = uVar12 + 1;
    } while (d + iVar18 + 1 != uVar12);
  }
  if (0 < N) {
    iVar18 = obj->idrift;
    psVar8 = obj->sarimax;
    uVar7 = psVar8->r;
    pdVar9 = psVar8->res;
    lVar14 = 0;
    local_e0 = xreg;
    do {
      dVar21 = inp[lVar14];
      if (D == 0 && d == 0) {
        dVar21 = dVar21 - dVar20;
      }
      W[lVar14] = dVar21;
      if (iVar18 == 1) {
        W[lVar14] = dVar21 - (double)((int)lVar14 + 1) * *obj->sarimax->exog;
      }
      if ((int)(uint)(iVar6 == 1) < (int)uVar7 && 0 < (int)uVar7) {
        pdVar17 = psVar8->exog;
        dVar21 = W[lVar14];
        uVar12 = (ulong)(iVar6 == 1);
        pdVar16 = local_e0;
        do {
          dVar21 = dVar21 - pdVar17[uVar12] * *pdVar16;
          W[lVar14] = dVar21;
          uVar12 = uVar12 + 1;
          pdVar16 = pdVar16 + lVar11;
        } while (uVar7 != uVar12);
      }
      resid[lVar14] = pdVar9[lVar14];
      lVar14 = lVar14 + 1;
      local_e0 = local_e0 + 1;
    } while (lVar14 != lVar11);
  }
  if (0 < (int)uVar10) {
    memset(theta,0,(ulong)uVar10 << 3);
    memset(phi,0,(ulong)uVar10 << 3);
  }
  if (0 < (int)uVar1) {
    pdVar9 = obj->sarimax->phi;
    uVar12 = 0;
    do {
      phi[uVar12] = pdVar9[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
  }
  if (0 < (int)uVar5) {
    pdVar9 = obj->sarimax->theta;
    uVar12 = 0;
    do {
      theta[uVar12] = -pdVar9[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
  }
  if (0 < (int)uVar2) {
    psVar8 = obj->sarimax;
    pdVar9 = psVar8->PHI;
    uVar12 = 0;
    pdVar17 = phi;
    do {
      pdVar17 = pdVar17 + lVar19;
      uVar13 = uVar12 + 1;
      phi[uVar13 * lVar19 + -1] = pdVar9[uVar12] + phi[uVar13 * lVar19 + -1];
      if (0 < (int)uVar1) {
        pdVar16 = psVar8->phi;
        uVar15 = 0;
        do {
          pdVar17[uVar15] = pdVar17[uVar15] - pdVar16[uVar15] * pdVar9[uVar12];
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      uVar12 = uVar13;
    } while (uVar13 != uVar2);
  }
  if (0 < (int)uVar3) {
    psVar8 = obj->sarimax;
    pdVar9 = psVar8->THETA;
    uVar12 = 0;
    pdVar17 = theta;
    do {
      pdVar17 = pdVar17 + lVar19;
      uVar13 = uVar12 + 1;
      theta[uVar13 * lVar19 + -1] = theta[uVar13 * lVar19 + -1] - pdVar9[uVar12];
      if (0 < (int)uVar5) {
        pdVar16 = psVar8->theta;
        uVar15 = 0;
        do {
          pdVar17[uVar15] = pdVar16[uVar15] * pdVar9[uVar12] + pdVar17[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
      }
      uVar12 = uVar13;
    } while (uVar13 != uVar3);
  }
  forkal(ip,uVar3 * iVar4 + uVar5,id,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    iVar4 = obj->idrift;
    psVar8 = obj->sarimax;
    uVar1 = psVar8->r;
    uVar12 = 0;
    do {
      dVar21 = xpred[uVar12];
      xpred[uVar12] = dVar21 + dVar20;
      if (iVar4 == 1) {
        xpred[uVar12] = (double)(N + 1 + (int)uVar12) * *obj->sarimax->exog + dVar21 + dVar20;
      }
      if ((int)(uint)(iVar6 == 1) < (int)uVar1) {
        pdVar9 = psVar8->exog;
        dVar21 = xpred[uVar12];
        pdVar17 = newxreg;
        uVar13 = (ulong)(iVar6 == 1);
        do {
          dVar21 = dVar21 + pdVar9[uVar13] * *pdVar17;
          xpred[uVar12] = dVar21;
          uVar13 = uVar13 + 1;
          pdVar17 = pdVar17 + (uint)L;
        } while (uVar1 != uVar13);
      }
      uVar12 = uVar12 + 1;
      newxreg = newxreg + 1;
    } while (uVar12 != (uint)L);
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void sarimax_wrapper_predict(sarimax_wrapper_object obj, double *inp, double *xreg, int L,double *newxreg, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j,diter;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->sarimax->d;
	N = obj->sarimax->N;
	p = obj->sarimax->p;
	q = obj->sarimax->q;
	D = obj->sarimax->D;
	P = obj->sarimax->P;
	Q = obj->sarimax->Q;
	s = obj->sarimax->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	diter = 0;

	if (obj->idrift == 1) {
		diter = 1;		
	}


	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->sarimax->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		if (obj->idrift == 1) {
			W[i] -= obj->sarimax->exog[0]*(i+1);
		}
		if (obj->sarimax->r > 0) {
			for(j = diter; j < obj->sarimax->r;++j) {
				W[i] -= obj->sarimax->exog[j] * xreg[(j-diter)*N+i];
			}
		}
		resid[i] = obj->sarimax->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->sarimax->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->sarimax->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->sarimax->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->sarimax->phi[i] * obj->sarimax->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->sarimax->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->sarimax->theta[i] * obj->sarimax->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
		if (obj->idrift == 1) {
			xpred[i] += obj->sarimax->exog[0]*(i+1+N);
		}
		for(j = diter; j < obj->sarimax->r;++j) {
			xpred[i] += obj->sarimax->exog[j] * newxreg[(j - diter)*L+i];
		}
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}